

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

bool proto2_unittest::TestParsingMergeLite::IsInitializedImpl(MessageLite *msg)

{
  bool bVar1;
  TestParsingMergeLite *extendee;
  TestParsingMergeLite *this_;
  MessageLite *msg_local;
  
  extendee = default_instance();
  bVar1 = google::protobuf::internal::ExtensionSet::IsInitialized
                    ((ExtensionSet *)(msg + 1),&extendee->super_MessageLite);
  if (bVar1) {
    bVar1 = _Internal::MissingRequiredFields((HasBits *)&msg[2]._internal_metadata_);
    if (bVar1) {
      msg_local._7_1_ = false;
    }
    else {
      msg_local._7_1_ = true;
    }
  }
  else {
    msg_local._7_1_ = false;
  }
  return msg_local._7_1_;
}

Assistant:

PROTOBUF_NOINLINE bool TestParsingMergeLite::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const TestParsingMergeLite&>(msg);
  if (!this_._impl_._extensions_.IsInitialized(&default_instance())) {
    return false;
  }
  if (_Internal::MissingRequiredFields(this_._impl_._has_bits_)) {
    return false;
  }
  return true;
}